

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_lib.cc
# Opt level: O3

bool __thiscall bssl::DTLS1_STATE::Init(DTLS1_STATE *this)

{
  _Head_base<0UL,_bssl::SSLAEADContext_*,_false> _Var1;
  _Head_base<0UL,_bssl::SSLAEADContext_*,_false> local_20;
  
  SSLAEADContext::CreateNullCipher();
  _Var1._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (pointer)0x0;
  std::__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter> *)
             &(this->read_epoch).aead,_Var1._M_head_impl);
  std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)&local_20);
  SSLAEADContext::CreateNullCipher();
  _Var1._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (SSLAEADContext *)0x0;
  std::__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter> *)
             &(this->write_epoch).aead,_Var1._M_head_impl);
  std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)&local_20);
  return (this->write_epoch).aead._M_t.
         super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl != (SSLAEADContext *)0x0
         && (this->read_epoch).aead._M_t.
            super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl !=
            (SSLAEADContext *)0x0;
}

Assistant:

bool DTLS1_STATE::Init() {
  // Set up the initial epochs.
  read_epoch.aead = SSLAEADContext::CreateNullCipher();
  write_epoch.aead = SSLAEADContext::CreateNullCipher();
  if (read_epoch.aead == nullptr || write_epoch.aead == nullptr) {
    return false;
  }

  return true;
}